

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<GraphContigger> * __thiscall
pybind11::class_<GraphContigger>::
def<void(GraphContigger::*)(GraphEditor&,PairedReadsDatastore&,int,bool),pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v>
          (class_<GraphContigger> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,
          arg *extra_1,arg_v *extra_2,arg_v *extra_3)

{
  offset_in_Node_to_subr f_00;
  name *extra_00;
  handle local_70;
  cpp_function cf;
  object local_60;
  arg_v *local_58;
  arg *local_50;
  handle local_48;
  is_method local_40;
  PyObject *local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_48.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_60.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58 = (arg_v *)extra_1;
  local_50 = extra;
  local_40.class_.m_ptr = (handle)(handle)name_;
  local_70.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_70.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_38 = local_70.m_ptr;
  cpp_function::
  cpp_function<void,GraphContigger,GraphEditor&,PairedReadsDatastore&,int,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v>
            (&cf,f_00,extra_00,&local_40,(sibling *)&local_48,(arg *)&local_38,local_50,local_58,
             extra_2);
  object::~object((object *)&local_70);
  object::~object(&local_60);
  detail::add_class_method((object *)this,name_,&cf);
  object::~object((object *)&cf);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }